

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

void uECC_vli_bytesToNative(uECC_word_t *native,uint8_t *bytes,int num_bytes)

{
  uint uVar1;
  uint uVar2;
  char local_1d;
  uint b;
  wordcount_t i;
  int num_bytes_local;
  uint8_t *bytes_local;
  uECC_word_t *native_local;
  
  uECC_vli_clear(native,(wordcount_t)((num_bytes + 7) / 8));
  for (local_1d = '\0'; local_1d < num_bytes; local_1d = local_1d + '\x01') {
    uVar1 = (num_bytes + -1) - (int)local_1d;
    uVar2 = uVar1 >> 3;
    native[uVar2] = (ulong)bytes[local_1d] << (sbyte)((uVar1 & 7) << 3) | native[uVar2];
  }
  return;
}

Assistant:

uECC_VLI_API void uECC_vli_bytesToNative(uECC_word_t *native,
                                         const uint8_t *bytes,
                                         int num_bytes) {
    wordcount_t i;
    uECC_vli_clear(native, (num_bytes + (uECC_WORD_SIZE - 1)) / uECC_WORD_SIZE);
    for (i = 0; i < num_bytes; ++i) {
        unsigned b = num_bytes - 1 - i;
        native[b / uECC_WORD_SIZE] |=
            (uECC_word_t)bytes[i] << (8 * (b % uECC_WORD_SIZE));
    }
}